

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  int iVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  pointer pUVar3;
  size_t sVar4;
  pointer pUVar5;
  size_t sVar6;
  int i;
  ulong uVar7;
  long lVar8;
  
  pvVar2 = this->fields_;
  if (pvVar2 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    sVar6 = 0;
  }
  else {
    pUVar3 = (pvVar2->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pUVar5 = (pvVar2->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar6 = (long)pUVar5 + (0x18 - (long)pUVar3);
    lVar8 = 8;
    for (uVar7 = 0; uVar7 < (ulong)((long)pUVar5 - (long)pUVar3 >> 4); uVar7 = uVar7 + 1) {
      iVar1 = *(int *)((long)pUVar3 + lVar8 + -4);
      if (iVar1 == 4) {
        sVar4 = SpaceUsedLong(*(UnknownFieldSet **)((long)&pUVar3->number_ + lVar8));
        sVar6 = sVar6 + sVar4;
      }
      else if (iVar1 == 3) {
        sVar4 = internal::StringSpaceUsedExcludingSelfLong
                          (*(string **)((long)&pUVar3->number_ + lVar8));
        sVar6 = sVar6 + sVar4 + 0x20;
      }
      pUVar3 = (this->fields_->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (this->fields_->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = lVar8 + 0x10;
    }
  }
  return sVar6;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_ == NULL) return 0;

  size_t total_size = sizeof(*fields_) + sizeof(UnknownField) * fields_->size();

  for (int i = 0; i < fields_->size(); i++) {
    const UnknownField& field = (*fields_)[i];
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.length_delimited_.string_value_) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.length_delimited_.string_value_);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group_->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}